

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::UniformBlockCase::iterate(UniformBlockCase *this)

{
  ShaderInterface *this_00;
  deUint32 *pdVar1;
  DataType dataType;
  int iVar2;
  TestLog *log;
  UniformBlock *pUVar3;
  _Base_ptr p_Var4;
  pointer ppUVar5;
  RenderContext *renderCtx;
  Context *pCVar6;
  mapped_type pvVar7;
  ContextInfo *pCVar8;
  code *pcVar9;
  pointer puVar10;
  pointer pBVar11;
  pointer pUVar12;
  bool bVar13;
  int iVar14;
  DataType DVar15;
  int iVar16;
  int iVar17;
  deUint32 dVar18;
  undefined4 extraout_var;
  ulong uVar20;
  pointer pBVar21;
  mapped_type *ppvVar22;
  const_iterator cVar23;
  char *pcVar24;
  ostream *poVar25;
  mapped_type_conflict *pmVar26;
  int i;
  uint uVar27;
  deUint32 dVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  size_t __n;
  int iVar32;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar33;
  undefined8 extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  int blockNdx_2;
  ulong uVar34;
  deUint32 binding_1;
  long lVar35;
  size_type __n_00;
  undefined1 isVertex;
  uint uVar36;
  ulong in_R9;
  pointer pUVar37;
  long lVar38;
  vector<int,_std::allocator<int>_> *this_01;
  int blockNdx;
  ulong uVar39;
  long lVar40;
  undefined8 *puVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  int numActiveUniforms;
  vector<char,_std::allocator<char>_> nameBuf;
  int numActiveBlocks;
  UniformBufferManager bufferManager;
  int numBlockUniforms;
  UniformLayout glLayout;
  int nameLen;
  undefined4 uStack_704;
  pointer local_700;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  UniformLayout refLayout;
  vector<int,_std::allocator<int>_> blockIndices;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<char,_std::allocator<char>_> nameBuf_1;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  vector<int,_std::allocator<int>_> matrixStrides;
  vector<int,_std::allocator<int>_> arrayStrides;
  vector<int,_std::allocator<int>_> offsets;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  pointer local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_548 [21];
  ShaderProgram program;
  ostringstream vtxSrc;
  ostringstream fragSrc;
  long lVar19;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar14);
  refLayout.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  refLayout.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &blockPointers._M_t._M_impl.super__Rb_tree_header._M_header;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  refLayout.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  refLayout.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  refLayout.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  refLayout.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar39 = 0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_00 = &this->m_interface;
  uVar31 = (ulong)((long)(this->m_interface).m_uniformBlocks.
                         super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface).m_uniformBlocks.
                        super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar34 = uVar31 & 0xffffffff;
  if ((int)uVar31 < 1) {
    uVar34 = uVar39;
  }
  for (; uVar39 != uVar34; uVar39 = uVar39 + 1) {
    pUVar3 = (this->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar39];
    if (((pUVar3->m_instanceName)._M_string_length == 0) ||
       ((pUVar3->m_instanceName)._M_dataplus._M_p == (pointer)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vtxSrc,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&rnd)
      ;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,(pUVar3->m_blockName)._M_dataplus._M_p,(allocator<char> *)&fragSrc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtxSrc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,".");
      std::__cxx11::string::~string((string *)&rnd);
    }
    glLayout.blocks.
    super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)glLayout.blocks.
                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    uVar42 = (long)refLayout.blocks.
                   super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)refLayout.blocks.
                   super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar31 = (long)refLayout.uniforms.
                   super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)refLayout.uniforms.
                   super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    for (pUVar37 = (pUVar3->m_uniforms).
                   super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl
                   .super__Vector_impl_data._M_start;
        pUVar37 !=
        (pUVar3->m_uniforms).
        super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
        super__Vector_impl_data._M_finish; pUVar37 = pUVar37 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtxSrc,
                     (pUVar37->m_name)._M_dataplus._M_p);
      uVar36 = pUVar37->m_flags;
      uVar27 = uVar36;
      if ((uVar36 & 0x38) == 0) {
        uVar27 = pUVar3->m_flags;
      }
      if ((uVar36 & 0xc0) == 0) {
        uVar36 = pUVar3->m_flags;
      }
      uVar36 = uVar36 & 0xc0 | uVar27 & 0x38;
      in_R9 = (ulong)uVar36;
      ub::anon_unknown_1::computeStd140Layout
                (&refLayout,(int *)&glLayout,(int)(uVar42 >> 6),(string *)&rnd,&pUVar37->m_type,
                 uVar36);
      std::__cxx11::string::~string((string *)&rnd);
    }
    uVar42 = (long)refLayout.uniforms.
                   super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)refLayout.uniforms.
                   super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    iVar17 = (int)glLayout.blocks.
                  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    iVar14 = pUVar3->m_arraySize;
    if (iVar14 < 2) {
      iVar14 = 1;
    }
    for (nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start._0_4_ = 0;
        (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start < iVar14;
        nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ =
             (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 1) {
      rnd.m_rnd._0_8_ = &local_568;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_568._M_allocated_capacity = local_568._M_allocated_capacity & 0xffffffffffffff00;
      local_558._M_p = local_558._M_p & 0xffffffff00000000;
      local_550 = (pointer)0x0;
      aaStack_548[0]._M_allocated_capacity = (pointer)0x0;
      aaStack_548[0]._8_8_ = (pointer)0x0;
      std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
      emplace_back<deqp::ub::BlockLayoutEntry>(&refLayout.blocks,(BlockLayoutEntry *)&rnd);
      ub::BlockLayoutEntry::~BlockLayoutEntry((BlockLayoutEntry *)&rnd);
      pBVar11 = refLayout.blocks.
                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pBVar21 = refLayout.blocks.
                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      std::__cxx11::string::assign((char *)pBVar21);
      pBVar11[-1].size = iVar17;
      uVar20 = uVar31 >> 6;
      while( true ) {
        rnd.m_rnd.x = (deUint32)uVar20;
        if ((int)(uVar42 >> 6) <= (int)(deUint32)uVar20) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pBVar11[-1].activeUniformIndices,(value_type_conflict1 *)&rnd);
        uVar20 = (ulong)(rnd.m_rnd.x + 1);
      }
      if (0 < pUVar3->m_arraySize) {
        de::toString<int>((string *)&program,(int *)&nameBuf);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fragSrc
                       ,"[",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &program);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fragSrc
                       ,"]");
        std::__cxx11::string::append((string *)pBVar21);
        std::__cxx11::string::~string((string *)&rnd);
        std::__cxx11::string::~string((string *)&fragSrc);
        std::__cxx11::string::~string((string *)&program);
      }
    }
    std::__cxx11::string::~string((string *)&vtxSrc);
  }
  iVar14 = 0;
  for (pBVar21 = refLayout.blocks.
                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pBVar21 !=
      refLayout.blocks.
      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish; pBVar21 = pBVar21 + 1) {
    iVar14 = iVar14 + pBVar21->size;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data,(long)iVar14);
  dVar28 = 0;
  iVar14 = 0;
  while( true ) {
    puVar10 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    rnd.m_rnd.x = dVar28;
    if ((int)((ulong)((long)refLayout.blocks.
                            super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)refLayout.blocks.
                           super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) <= (int)dVar28) break;
    ppvVar22 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::operator[](&blockPointers,(key_type_conflict *)&rnd);
    *ppvVar22 = puVar10 + iVar14;
    dVar28 = rnd.m_rnd.x + 1;
    iVar14 = iVar14 + refLayout.blocks.
                      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)rnd.m_rnd.x].size;
  }
  deRandom_init(&rnd.m_rnd,1);
  uVar34 = (long)refLayout.blocks.
                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)refLayout.blocks.
                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0;
  do {
    if ((int)(uVar34 >> 6) <=
        (int)(uint)vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtxSrc);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragSrc);
      pcVar24 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      poVar25 = std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,pcVar24);
      std::operator<<(poVar25,"\n");
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "in highp vec4 a_position;\n");
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "out mediump float v_vtxResult;\n");
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_568._M_allocated_capacity = 0;
      ub::ShaderInterface::getNamedStructs
                (this_00,(vector<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                          *)&rnd);
      uVar33 = extraout_RDX;
      for (puVar41 = (undefined8 *)rnd.m_rnd._0_8_; puVar41 != (undefined8 *)rnd.m_rnd._8_8_;
          puVar41 = puVar41 + 1) {
        ub::anon_unknown_1::generateDeclaration(&vtxSrc,(StructType *)*puVar41,(int)uVar33);
        uVar33 = extraout_RDX_00;
      }
      for (lVar38 = 0;
          ppUVar5 = (this->m_interface).m_uniformBlocks.
                    super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar38 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                       super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar5)
                        >> 3); lVar38 = lVar38 + 1) {
        pUVar3 = ppUVar5[lVar38];
        if ((pUVar3->m_flags & 0x100) != 0) {
          ub::anon_unknown_1::generateDeclaration(&vtxSrc,pUVar3);
        }
      }
      poVar25 = std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      std::operator<<(poVar25,
                      "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\nmediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\nmediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\nmediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\nmediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\nmediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\nmediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\nmediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\nmediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\nmediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\nmediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\nmediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\nmediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\nmediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\nmediump float compare_ivec2    (highp ivec2 a, highp ivec2..." /* TRUNCATED STRING LITERAL */
                     );
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\nvoid main (void)\n{\n    gl_Position = a_position;\n    mediump float result = 1.0;\n"
                     );
      ub::anon_unknown_1::generateCompareSrc
                (&vtxSrc,(char *)this_00,(ShaderInterface *)&refLayout,
                 (UniformLayout *)&blockPointers,
                 (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )&DAT_00000001,SUB81(in_R9,0));
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "    v_vtxResult = result;\n}\n");
      std::_Vector_base<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
      ::~_Vector_base((_Vector_base<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                       *)&rnd);
      pcVar24 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      poVar25 = std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,pcVar24)
      ;
      std::operator<<(poVar25,"\n");
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "in mediump float v_vtxResult;\n");
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_568._M_allocated_capacity = 0;
      ub::ShaderInterface::getNamedStructs
                (this_00,(vector<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                          *)&rnd);
      uVar33 = extraout_RDX_01;
      for (puVar41 = (undefined8 *)rnd.m_rnd._0_8_; puVar41 != (undefined8 *)rnd.m_rnd._8_8_;
          puVar41 = puVar41 + 1) {
        ub::anon_unknown_1::generateDeclaration(&fragSrc,(StructType *)*puVar41,(int)uVar33);
        uVar33 = extraout_RDX_02;
      }
      lVar38 = 0;
      while( true ) {
        isVertex = (undefined1)in_R9;
        ppUVar5 = (this->m_interface).m_uniformBlocks.
                  super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar5) >> 3) <=
            lVar38) break;
        pUVar3 = ppUVar5[lVar38];
        if ((pUVar3->m_flags & 0x200) != 0) {
          ub::anon_unknown_1::generateDeclaration(&fragSrc,pUVar3);
        }
        lVar38 = lVar38 + 1;
      }
      poVar25 = std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      std::operator<<(poVar25,
                      "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\nmediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\nmediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\nmediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\nmediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\nmediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\nmediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\nmediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\nmediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\nmediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\nmediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\nmediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\nmediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\nmediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\nmediump float compare_ivec2    (highp ivec2 a, highp ivec2..." /* TRUNCATED STRING LITERAL */
                     );
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\nvoid main (void)\n{\n    mediump float result = 1.0;\n");
      ub::anon_unknown_1::generateCompareSrc
                (&fragSrc,(char *)this_00,(ShaderInterface *)&refLayout,
                 (UniformLayout *)&blockPointers,
                 (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )0x0,(bool)isVertex);
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "    dEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n");
      std::_Vector_base<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
      ::~_Vector_base((_Vector_base<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                       *)&rnd);
      renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&glLayout,
                 (char *)CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start),
                 (allocator<char> *)&numBlockUniforms);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bufferManager,(char *)CONCAT44(uStack_704,nameLen),
                 (allocator<char> *)&blockIndices);
      glu::makeVtxFragSources((ProgramSources *)&rnd,(string *)&glLayout,(string *)&bufferManager);
      glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&rnd);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&rnd);
      std::__cxx11::string::~string((string *)&bufferManager);
      std::__cxx11::string::~string((string *)&nameLen);
      std::__cxx11::string::~string((string *)&glLayout);
      std::__cxx11::string::~string((string *)&nameBuf);
      glu::operator<<(log,&program);
      dVar28 = program.m_program.m_program;
      if (program.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Compile failed");
      }
      else {
        glLayout.uniforms.
        super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        glLayout.uniforms.
        super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        glLayout.blocks.
        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        glLayout.uniforms.
        super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        glLayout.blocks.
        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        glLayout.blocks.
        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        numActiveBlocks = 0;
        (**(code **)(lVar19 + 0x9d8))(program.m_program.m_program,0x8b86);
        (**(code **)(lVar19 + 0x9d8))(dVar28,0x8a36,&numActiveBlocks);
        dVar18 = (**(code **)(lVar19 + 0x800))();
        __n = 0x45b;
        glu::checkError(dVar18,"Failed to get number of uniforms and uniform blocks",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x45b);
        std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::resize
                  (&glLayout.blocks,(long)numActiveBlocks);
        lVar38 = 0x28;
        for (uVar34 = 0;
            pBVar21 = glLayout.blocks.
                      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (long)uVar34 < (long)numActiveBlocks; uVar34 = uVar34 + 1) {
          (**(code **)(lVar19 + 0x760))(dVar28,uVar34 & 0xffffffff,0x8a40,&bufferManager);
          (**(code **)(lVar19 + 0x760))(dVar28,uVar34 & 0xffffffff,0x8a41,&nameLen);
          (**(code **)(lVar19 + 0x760))(dVar28,uVar34 & 0xffffffff,0x8a42,&numBlockUniforms);
          dVar18 = (**(code **)(lVar19 + 0x800))();
          glu::checkError(dVar18,"Uniform block query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x46a);
          __n_00 = (size_type)(uint)nameLen;
          if (nameLen < 2) {
            __n_00 = 1;
          }
          std::vector<char,_std::allocator<char>_>::vector(&nameBuf,__n_00,(allocator_type *)&rnd);
          (**(code **)(lVar19 + 0x758))
                    (dVar28,uVar34 & 0xffffffff,
                     (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rnd,
                     (char *)CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start),
                     (allocator<char> *)&blockIndices);
          std::__cxx11::string::operator=((string *)((long)pBVar21 + lVar38 + -0x28),(string *)&rnd)
          ;
          std::__cxx11::string::~string((string *)&rnd);
          this_01 = (vector<int,_std::allocator<int>_> *)
                    ((long)&(pBVar21->name)._M_dataplus._M_p + lVar38);
          *(undefined4 *)((long)pBVar21 + lVar38 + -8) = bufferManager.m_renderCtx._0_4_;
          std::vector<int,_std::allocator<int>_>::resize(this_01,(long)numBlockUniforms);
          if (0 < numBlockUniforms) {
            (**(code **)(lVar19 + 0x760))
                      (dVar28,uVar34 & 0xffffffff,0x8a43,
                       (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start);
          }
          dVar18 = (**(code **)(lVar19 + 0x800))();
          __n = 0x478;
          glu::checkError(dVar18,"Uniform block query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x478);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&nameBuf.super__Vector_base<char,_std::allocator<char>_>);
          lVar38 = lVar38 + 0x40;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nameBuf,"ActiveUniformBlocks",(allocator<char> *)&nameLen);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bufferManager,"Active Uniform Blocks",
                   (allocator<char> *)&numBlockUniforms);
        tcu::LogSection::LogSection((LogSection *)&rnd,(string *)&nameBuf,(string *)&bufferManager);
        tcu::LogSection::write((LogSection *)&rnd,(int)log,__buf,__n);
        tcu::LogSection::~LogSection((LogSection *)&rnd);
        std::__cxx11::string::~string((string *)&bufferManager);
        std::__cxx11::string::~string((string *)&nameBuf);
        pdVar1 = &rnd.m_rnd.z;
        lVar38 = 0;
        for (lVar35 = 0;
            lVar35 < (int)((ulong)((long)glLayout.blocks.
                                         super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)glLayout.blocks.
                                        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6);
            lVar35 = lVar35 + 1) {
          rnd.m_rnd._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
          std::ostream::operator<<(pdVar1,(int)lVar35);
          std::operator<<((ostream *)pdVar1,": ");
          ub::operator<<((ostream *)pdVar1,
                         (BlockLayoutEntry *)
                         ((long)&((glLayout.blocks.
                                   super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar38));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
          lVar38 = lVar38 + 0x40;
        }
        tcu::TestLog::endSection(log);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nameBuf,"ActiveUniforms",(allocator<char> *)&nameLen);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bufferManager,"Active Uniforms",(allocator<char> *)&numBlockUniforms);
        tcu::LogSection::LogSection((LogSection *)&rnd,(string *)&nameBuf,(string *)&bufferManager);
        tcu::LogSection::write((LogSection *)&rnd,(int)log,__buf_00,__n);
        tcu::LogSection::~LogSection((LogSection *)&rnd);
        std::__cxx11::string::~string((string *)&bufferManager);
        std::__cxx11::string::~string((string *)&nameBuf);
        pdVar1 = &rnd.m_rnd.z;
        lVar38 = 0;
        for (lVar35 = 0;
            lVar35 < (int)((ulong)((long)glLayout.uniforms.
                                         super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)glLayout.uniforms.
                                        super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6);
            lVar35 = lVar35 + 1) {
          rnd.m_rnd._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
          std::ostream::operator<<(pdVar1,(int)lVar35);
          std::operator<<((ostream *)pdVar1,": ");
          ub::operator<<((ostream *)pdVar1,
                         (UniformLayoutEntry *)
                         ((long)&((glLayout.uniforms.
                                   super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar38));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
          lVar38 = lVar38 + 0x40;
        }
        tcu::TestLog::endSection(log);
        bVar43 = checkLayoutIndices(this,&glLayout);
        if (((bVar43) && (bVar43 = checkLayoutBounds(this,&glLayout), bVar43)) &&
           (bVar43 = compareTypes(this,&refLayout,&glLayout), bVar43)) {
          bVar43 = compareStd140Blocks(this,&refLayout,&glLayout);
          if (!bVar43) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid std140 layout");
          }
          bVar43 = compareSharedBlocks(this,&refLayout,&glLayout);
          if (!bVar43) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid shared layout");
          }
          bVar43 = checkIndexQueries(this,program.m_program.m_program,&glLayout);
          if (!bVar43) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Inconsintent block index query results");
          }
          (**(code **)(lVar19 + 0x1680))(program.m_program.m_program);
          for (iVar14 = 0;
              iVar14 < (int)((ulong)((long)glLayout.blocks.
                                           super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)glLayout.blocks.
                                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 6);
              iVar14 = iVar14 + 1) {
            (**(code **)(lVar19 + 0x15d0))(program.m_program.m_program,iVar14,iVar14);
          }
          dVar28 = (**(code **)(lVar19 + 0x800))();
          glu::checkError(dVar28,"Failed to set uniform block bindings",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x5a2);
          pCVar6 = (this->super_TestCase).m_context;
          bufferManager.m_renderCtx = pCVar6->m_renderCtx;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar34 = (ulong)((long)glLayout.blocks.
                                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)glLayout.blocks.
                                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6;
          iVar14 = (int)uVar34;
          local_568._8_8_ = pdVar1;
          if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&nameBuf,(long)iVar14,(allocator_type *)&rnd);
            rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ & 0xffffffff00000000;
            local_568._M_allocated_capacity = 0;
            local_550 = (pointer)0x0;
            local_558._M_p = (pointer)pdVar1;
            for (nameLen = 0; nameLen < iVar14; nameLen = nameLen + 1) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)nameLen * 0x18 +
                         CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start)),
                         (long)glLayout.blocks.
                               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start[nameLen].size);
              pvVar7 = *(mapped_type *)
                        (CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start) +
                        (long)nameLen * 0x18);
              ppvVar22 = std::
                         map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                       *)&rnd,&nameLen);
              *ppvVar22 = pvVar7;
            }
            ub::anon_unknown_1::copyUniformData
                      (&glLayout,
                       (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)&rnd,&refLayout,&blockPointers);
            uVar31 = 0;
            uVar39 = 0;
            if (0 < iVar14) {
              uVar39 = uVar34 & 0xffffffff;
            }
            lVar38 = 8;
            for (; uVar39 != uVar31; uVar31 = uVar31 + 1) {
              dVar28 = ub::UniformBufferManager::allocBuffer(&bufferManager);
              (**(code **)(lVar19 + 0x40))(0x8a11,dVar28);
              lVar35 = *(long *)(CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)nameBuf.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.super__Vector_impl_data._M_start) + -8 +
                                lVar38);
              (**(code **)(lVar19 + 0x150))
                        (0x8a11,*(long *)(CONCAT44(nameBuf.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)nameBuf.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) + lVar38
                                         ) - lVar35,lVar35,0x88e4);
              dVar18 = (**(code **)(lVar19 + 0x800))();
              glu::checkError(dVar18,"Failed to upload uniform buffer data",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                              ,0x5bc);
              (**(code **)(lVar19 + 0x48))(0x8a11,uVar31 & 0xffffffff,dVar28);
              dVar28 = (**(code **)(lVar19 + 0x800))();
              glu::checkError(dVar28,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                              ,0x5bf);
              lVar38 = lVar38 + 0x18;
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         *)&rnd);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&nameBuf);
          }
          else {
            pCVar8 = pCVar6->m_contextInfo;
            iVar16 = (*pCVar8->_vptr_ContextInfo[2])(pCVar8,0x8a34);
            rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ & 0xffffffff00000000;
            local_568._M_allocated_capacity = 0;
            local_550 = (pointer)0x0;
            iVar17 = 0;
            local_558._M_p = (pointer)pdVar1;
            for (nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_ = 0;
                (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start < iVar14;
                nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + 1) {
              if ((0 < iVar16) && ((iVar17 / iVar16) * iVar16 != iVar17)) {
                iVar17 = (iVar17 / iVar16 + 1) * iVar16;
              }
              pmVar26 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&rnd,(key_type_conflict *)&nameBuf);
              *pmVar26 = iVar17;
              iVar17 = iVar17 + glLayout.blocks.
                                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start].size;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nameLen,
                       (long)iVar17,(allocator_type *)&nameBuf);
            nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = 0;
            nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            for (numBlockUniforms = 0; numBlockUniforms < iVar14;
                numBlockUniforms = numBlockUniforms + 1) {
              pmVar26 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&rnd,&numBlockUniforms);
              iVar17 = *pmVar26;
              lVar38 = CONCAT44(uStack_704,nameLen);
              ppvVar22 = std::
                         map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                       *)&nameBuf,&numBlockUniforms);
              *ppvVar22 = (mapped_type)(lVar38 + iVar17);
            }
            ub::anon_unknown_1::copyUniformData
                      (&glLayout,
                       (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)&nameBuf,&refLayout,&blockPointers);
            dVar28 = ub::UniformBufferManager::allocBuffer(&bufferManager);
            (**(code **)(lVar19 + 0x40))(0x8a11,dVar28);
            puVar10 = (pointer)CONCAT44(uStack_704,nameLen);
            if (puVar10 != local_700) {
              (**(code **)(lVar19 + 0x150))(0x8a11,(long)local_700 - (long)puVar10,puVar10,0x88e4);
            }
            dVar18 = (**(code **)(lVar19 + 0x800))();
            glu::checkError(dVar18,"Failed to upload uniform buffer data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5e7);
            iVar17 = 0;
            while (numBlockUniforms = iVar17, iVar17 < iVar14) {
              pcVar9 = *(code **)(lVar19 + 0x50);
              pmVar26 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&rnd,&numBlockUniforms);
              (*pcVar9)(0x8a11,iVar17,dVar28,(long)*pmVar26,
                        (long)glLayout.blocks.
                              super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start[numBlockUniforms].size);
              dVar18 = (**(code **)(lVar19 + 0x800))();
              glu::checkError(dVar18,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                              ,0x5f0);
              iVar17 = numBlockUniforms + 1;
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         *)&nameBuf);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nameLen);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&rnd);
          }
          bVar43 = render(this,&program);
          if (!bVar43) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Image compare failed");
          }
          ub::UniformBufferManager::~UniformBufferManager(&bufferManager);
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid layout");
        }
        ub::UniformLayout::~UniformLayout(&glLayout);
      }
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragSrc);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtxSrc);
      std::
      _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
      ::~_Rb_tree(&blockPointers._M_t);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ub::UniformLayout::~UniformLayout(&refLayout);
      return STOP;
    }
    cVar23 = std::
             _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
             ::find(&blockPointers._M_t,(key_type_conflict *)&vtxSrc);
    p_Var4 = cVar23._M_node[1]._M_parent;
    uVar31 = (ulong)(int)(uint)vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream;
    uVar39 = (ulong)((long)refLayout.blocks.
                           super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31].activeUniformIndices.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)refLayout.blocks.
                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar31].activeUniformIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar42 = uVar39 & 0xffffffff;
    if ((int)uVar39 < 1) {
      uVar42 = 0;
    }
    for (uVar39 = 0;
        pUVar12 = refLayout.uniforms.
                  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar39 != uVar42; uVar39 = uVar39 + 1)
    {
      iVar14 = refLayout.blocks.
               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar31].activeUniformIndices.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar39];
      DVar15 = glu::getDataTypeScalarType
                         (refLayout.uniforms.
                          super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar14].type);
      iVar16 = glu::getDataTypeScalarSize(pUVar12[iVar14].type);
      dataType = pUVar12[iVar14].type;
      bVar43 = dataType - TYPE_FLOAT_MAT2 < 9;
      bVar44 = dataType - TYPE_DOUBLE_MAT2 < 9;
      iVar17 = 1;
      if (bVar44 || bVar43) {
        if (pUVar12[iVar14].isRowMajor == true) {
          iVar17 = glu::getDataTypeMatrixNumRows(dataType);
        }
        else {
          iVar17 = glu::getDataTypeMatrixNumColumns(dataType);
        }
      }
      uVar31 = (long)iVar16 / (long)iVar17 & 0xffffffff;
      iVar2 = pUVar12[iVar14].size;
      iVar30 = 0;
      if ((int)((long)iVar16 / (long)iVar17) < 1) {
        uVar31 = 0;
      }
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      iVar16 = iVar2;
      for (; iVar30 < iVar16; iVar30 = iVar30 + 1) {
        iVar16 = pUVar12[iVar14].offset;
        iVar29 = pUVar12[iVar14].arrayStride * iVar30;
        iVar32 = 0;
        if (iVar2 < 2) {
          iVar29 = 0;
        }
        for (; iVar32 != iVar17; iVar32 = iVar32 + 1) {
          lVar38 = (long)(pUVar12[iVar14].matrixStride * iVar32);
          if (!bVar44 && !bVar43) {
            lVar38 = 0;
          }
          lVar38 = lVar38 + (long)iVar29 + (long)iVar16;
          for (lVar35 = 0; uVar31 * 4 != lVar35; lVar35 = lVar35 + 4) {
            lVar40 = (long)(int)lVar35;
            if (DVar15 == TYPE_BOOL) {
              bVar13 = de::Random::getBool((Random *)&rnd.m_rnd);
              uVar36 = 0;
              if (bVar13) {
                dVar28 = deRandom_getUint32(&rnd.m_rnd);
                uVar36 = dVar28 | 1;
              }
              *(uint *)((long)&p_Var4->_M_color + lVar40 + lVar38) = uVar36;
            }
            else {
              if (DVar15 == TYPE_INT) {
                dVar28 = deRandom_getUint32(&rnd.m_rnd);
                uVar36 = dVar28 % 0x13 - 9;
              }
              else {
                if (DVar15 != TYPE_UINT) {
                  if (DVar15 == TYPE_FLOAT) {
                    dVar28 = deRandom_getUint32(&rnd.m_rnd);
                    *(float *)((long)&p_Var4->_M_color + lVar40 + lVar38) =
                         (float)(int)(dVar28 % 0x13 - 9);
                  }
                  goto LAB_00d98b5c;
                }
                dVar28 = deRandom_getUint32(&rnd.m_rnd);
                uVar36 = dVar28 % 10;
              }
              *(uint *)((long)&p_Var4->_M_color + lVar40 + lVar38) = uVar36;
            }
LAB_00d98b5c:
          }
        }
        iVar16 = pUVar12[iVar14].size;
      }
      uVar31 = (ulong)(uint)vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream;
    }
    vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
         (int)uVar31 + 1;
  } while( true );
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	UniformLayout		  refLayout; //!< std140 layout.
	vector<deUint8>		  data;		 //!< Data.
	map<int, void*> blockPointers;   //!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin();
			 blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(vtxSrc.str().c_str(), fragSrc.str().c_str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_context.getRenderContext());
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int						 numBlocks = (int)glLayout.blocks.size();
		vector<vector<deUint8> > glData(numBlocks);
		map<int, void*> glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 buffer  = bufferManager.allocBuffer();
			deUint32 binding = (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0],
						  GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int totalSize		 = 0;
		int curOffset		 = 0;
		int numBlocks		 = (int)glLayout.blocks.size();
		int bindingAlignment = m_context.getContextInfo().getInt(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT);
		map<int, int> glBlockOffsets;

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset			 = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8> glData(totalSize);
		map<int, void*> glBlockPointers;

		for (int blockNdx			  = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx],
							   (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
			curOffset += glLayout.blocks[blockNdx].size;
		}
	}

	bool renderOk = render(program);
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}